

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_union_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  uint8_t n;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  char *pcVar8;
  size_t __n;
  char *pcVar9;
  size_t sVar10;
  flatcc_json_printer_union_descriptor_t ud;
  flatcc_json_printer_union_descriptor_t local_40;
  
  uVar4 = id * 2 + 2;
  if ((uVar4 < (uint)td->vsize) &&
     (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar4), uVar5 != 0)) {
    puVar6 = (uint8_t *)(uVar5 + (long)td->table);
  }
  else {
    puVar6 = (uint8_t *)0x0;
  }
  uVar4 = id * 2 + 4;
  if (((uVar4 < (uint)td->vsize) &&
      (uVar5 = (ulong)*(ushort *)((long)td->vtable + (ulong)uVar4), uVar5 != 0)) &&
     (puVar6 != (uint8_t *)0x0)) {
    pvVar2 = td->table;
    n = *puVar6;
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar8 = ctx->p;
      ctx->p = pcVar8 + 1;
      *pcVar8 = ',';
    }
    pcVar8 = ctx->p;
    if (ctx->indent == '\0') {
      if (ctx->pflush <= pcVar8) {
        (*ctx->flush)(ctx,0);
        pcVar8 = ctx->p;
      }
    }
    else {
      ctx->p = pcVar8 + 1;
      *pcVar8 = '\n';
      uVar7 = (ulong)ctx->indent * (long)ctx->level;
      pcVar8 = ctx->pflush;
      pcVar9 = ctx->p;
      if (pcVar8 < pcVar9 + uVar7) {
        if (pcVar8 <= pcVar9) {
          (*ctx->flush)(ctx,0);
          pcVar8 = ctx->pflush;
          pcVar9 = ctx->p;
        }
        sVar10 = (long)pcVar8 - (long)pcVar9;
        if (sVar10 < uVar7) {
          do {
            memset(pcVar9,0x20,sVar10);
            ctx->p = ctx->p + sVar10;
            uVar7 = uVar7 - sVar10;
            (*ctx->flush)(ctx,0);
            pcVar9 = ctx->p;
            sVar10 = (long)ctx->pflush - (long)pcVar9;
          } while (sVar10 < uVar7);
        }
      }
      memset(pcVar9,0x20,uVar7);
      pcVar8 = ctx->p + uVar7;
      ctx->p = pcVar8;
    }
    *pcVar8 = '\"';
    pcVar9 = ctx->p + (ctx->unquote == '\0');
    pcVar8 = ctx->pflush;
    ctx->p = pcVar9;
    uVar7 = len;
    if (pcVar9 + len < pcVar8) {
      memcpy(pcVar9,name,len);
    }
    else {
      if (pcVar8 <= pcVar9) {
        (*ctx->flush)(ctx,0);
        pcVar8 = ctx->pflush;
        pcVar9 = ctx->p;
      }
      sVar10 = (long)pcVar8 - (long)pcVar9;
      pcVar8 = name;
      if (sVar10 < len) {
        do {
          memcpy(pcVar9,pcVar8,sVar10);
          ctx->p = ctx->p + sVar10;
          pcVar8 = pcVar8 + sVar10;
          uVar7 = uVar7 - sVar10;
          (*ctx->flush)(ctx,0);
          pcVar9 = ctx->p;
          sVar10 = (long)ctx->pflush - (long)pcVar9;
        } while (sVar10 < uVar7);
      }
      memcpy(pcVar9,pcVar8,uVar7);
    }
    pcVar9 = ctx->pflush;
    pcVar3 = ctx->p;
    pcVar8 = pcVar3 + uVar7;
    ctx->p = pcVar8;
    if (pcVar3 + uVar7 + 5 < pcVar9) {
      builtin_strncpy(pcVar3 + uVar7,"_type",5);
      __n = 5;
    }
    else {
      if (pcVar9 <= pcVar8) {
        (*ctx->flush)(ctx,0);
        pcVar9 = ctx->pflush;
        pcVar8 = ctx->p;
      }
      sVar10 = (long)pcVar9 - (long)pcVar8;
      if (sVar10 < 5) {
        pcVar9 = "_type";
        __n = 5;
        do {
          memcpy(pcVar8,pcVar9,sVar10);
          ctx->p = ctx->p + sVar10;
          pcVar9 = pcVar9 + sVar10;
          __n = __n - sVar10;
          (*ctx->flush)(ctx,0);
          pcVar8 = ctx->p;
          sVar10 = (long)ctx->pflush - (long)pcVar8;
        } while (sVar10 < __n);
      }
      else {
        __n = 5;
        pcVar9 = "_type";
      }
      memcpy(pcVar8,pcVar9,__n);
    }
    pcVar8 = ctx->p;
    ctx->p = pcVar8 + __n;
    pcVar8[__n] = '\"';
    pcVar8 = ctx->p;
    ctx->p = pcVar8 + (ctx->unquote == '\0') + 1;
    pcVar8[ctx->unquote == '\0'] = ':';
    *ctx->p = ' ';
    pcVar8 = ctx->p;
    ctx->p = pcVar8 + (ctx->indent != '\0');
    if (ctx->noenum == '\0') {
      (*ptf)(ctx,n);
    }
    else {
      uVar4 = print_uint8(n,pcVar8 + (ctx->indent != '\0'));
      ctx->p = ctx->p + uVar4;
    }
    if (n != '\0') {
      pcVar8 = ctx->p;
      ctx->p = pcVar8 + 1;
      *pcVar8 = ',';
      print_name(ctx,name,len);
      local_40.ttl = td->ttl;
      local_40.member = (void *)(uVar5 + (long)pvVar2);
      local_40.type = n;
      (*pf)(ctx,&local_40);
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_union_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const void *pt = get_field_ptr(td, id - 1);
    const void *p = get_field_ptr(td, id);
    utype_t type;
    flatcc_json_printer_union_descriptor_t ud;

    if (!p || !pt) {
        return;
    }
    type = __flatbuffers_utype_read_from_pe(pt);
    if (td->count++) {
        print_char(',');
    }
    print_nl();
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    print(ctx, "_type", 5);
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    print_char(':');
    print_space();
    if (ctx->noenum) {
        ctx->p += print_utype(type, ctx->p);
    } else {
        ptf(ctx, type);
    }
    if (type != 0) {
        print_char(',');
        print_name(ctx, name, len);
        ud.ttl = td->ttl;
        ud.type = type;
        ud.member = p;
        pf(ctx, &ud);
    }
}